

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::draw_pick(Mesh *this,int *pickID,bool transformed)

{
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar1;
  float fVar2;
  long lVar3;
  double dVar4;
  pointer pVVar5;
  _List_node_base *p_Var6;
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar7;
  _List_node_base *p_Var8;
  undefined8 in_XMM1_Qa;
  undefined4 uVar9;
  Vector3D a1;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  Vector3D b2;
  Vector3D q1;
  Vector3D p1;
  Vector3D b1;
  Vector3D c;
  Vector3D r2;
  Vector3D r1;
  Vector3D q2;
  Vector3D p2;
  Vector3D a2;
  
  uVar9 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  std::
  _Rb_tree<int,_std::pair<const_int,_CMU462::HalfedgeElement_*>,_std::_Select1st<std::pair<const_int,_CMU462::HalfedgeElement_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
  ::clear(&(this->idToElement)._M_t);
  if ((this->super_SceneObject).isGhosted == false) {
    originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (transformed) {
      glPushMatrix();
      glTranslatef((float)(this->super_SceneObject).position.x,
                   CONCAT44(uVar9,(float)(this->super_SceneObject).position.y),
                   (float)(this->super_SceneObject).position.z);
      glRotatef((float)(this->super_SceneObject).rotation.x,0x3f800000,0,0);
      glRotatef((float)(this->super_SceneObject).rotation.y,0,0x3f800000,0);
      uVar9 = 0;
      glRotatef((float)(this->super_SceneObject).rotation.z,0,0,0x3f800000);
      glScalef((float)(this->super_SceneObject).scale.x,
               CONCAT44(uVar9,(float)(this->super_SceneObject).scale.y),
               (float)(this->super_SceneObject).scale.z);
      plVar7 = &(this->mesh).vertices;
      p_Var6 = (_List_node_base *)plVar7;
      while (p_Var6 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                       &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var6 != (_List_node_base *)plVar7) {
        std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                  (&originalPositions,(value_type *)&p_Var6[1]._M_prev);
        fVar2 = *(float *)((long)&p_Var6[6]._M_prev + 4);
        Vertex::normal(&a1,(Vertex *)(p_Var6 + 1));
        dVar4 = (double)fVar2;
        c.z = a1.z * dVar4;
        c.y._0_4_ = SUB84(dVar4 * a1.y,0);
        c.x = dVar4 * a1.x;
        c.y._4_4_ = (int)((ulong)(dVar4 * a1.y) >> 0x20);
        Vector3D::operator+=((Vector3D *)&p_Var6[1]._M_prev,&c);
      }
    }
    plVar1 = &(this->mesh).faces;
    p_Var6 = (_List_node_base *)plVar1;
    while (p_Var6 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var6->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar1) {
      (**(code **)p_Var6[1]._M_next)(&c);
      p_Var8 = p_Var6[0xb]._M_prev;
      do {
        lVar3 = (long)p_Var8[2]._M_next;
        a1.x = 0.0;
        a1.y = 0.0;
        a1.z = 0.0;
        b1.x = 0.0;
        b1.y = 0.0;
        b1.z = 0.0;
        p1.x = 0.0;
        p1.y = 0.0;
        p1.z = 0.0;
        q1.x = 0.0;
        q1.y = 0.0;
        q1.z = 0.0;
        r1.x = 0.0;
        r1.y = 0.0;
        r1.z = 0.0;
        a2.x = 0.0;
        a2.y = 0.0;
        a2.z = 0.0;
        b2.x = 0.0;
        b2.y = 0.0;
        b2.z = 0.0;
        p2.x = 0.0;
        p2.y = 0.0;
        p2.z = 0.0;
        q2.x = 0.0;
        q2.y = 0.0;
        q2.z = 0.0;
        r2.x = 0.0;
        r2.y = 0.0;
        r2.z = 0.0;
        Halfedge::getPickPoints((Halfedge *)(p_Var8 + 1),&a1,&b1,&p1,&q1,&r1);
        Halfedge::getPickPoints((Halfedge *)(lVar3 + 0x10),&a2,&b2,&p2,&q2,&r2);
        glBegin(4);
        newPickElement(this,pickID,(HalfedgeElement *)(*(long *)(lVar3 + 0x28) + 0x10));
        glVertex3dv(&a1);
        glVertex3dv(&p1);
        glVertex3dv(&r1);
        newPickElement(this,pickID,(HalfedgeElement *)(p_Var6 + 1));
        glVertex3dv(&b1);
        glVertex3dv(&b2);
        glVertex3dv(&c);
        glEnd();
        glBegin(7);
        newPickElement(this,pickID,(HalfedgeElement *)(*(long *)(lVar3 + 0x30) + 0x10));
        glVertex3dv(&p1);
        glVertex3dv(&r2);
        glVertex3dv(&q2);
        glVertex3dv(&q1);
        newPickElement(this,pickID,(HalfedgeElement *)(lVar3 + 0x10));
        glVertex3dv(&q1);
        glVertex3dv(&q2);
        glVertex3dv(&b2);
        glVertex3dv(&b1);
        glEnd();
        p_Var8 = p_Var8[2]._M_next;
      } while (p_Var6[0xb]._M_prev != p_Var8);
    }
    if (transformed) {
      glPopMatrix();
      plVar7 = &(this->mesh).vertices;
      pVVar5 = originalPositions.
               super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
               super__Vector_impl_data._M_start;
      p_Var6 = (_List_node_base *)plVar7;
      while (p_Var6 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                       &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var6 != (_List_node_base *)plVar7) {
        p_Var6[2]._M_prev = (_List_node_base *)pVVar5->z;
        dVar4 = pVVar5->y;
        p_Var6[1]._M_prev = (_List_node_base *)pVVar5->x;
        p_Var6[2]._M_next = (_List_node_base *)dVar4;
        pVVar5 = pVVar5 + 1;
      }
    }
    std::_Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~_Vector_base
              (&originalPositions.
                super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>);
  }
  return;
}

Assistant:

void Mesh::draw_pick( int& pickID, bool transformed )
{
   idToElement.clear();
   if (isGhosted) return;
   vector<Vector3D> originalPositions;

   if (transformed) {
     glPushMatrix();
     glTranslatef(position.x, position.y, position.z);
     glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
     glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
     glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
     glScalef(scale.x, scale.y, scale.z);
     for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
       originalPositions.push_back(v->position);
       v->position += v->offset * v->normal();
     }
   }

   for( FaceIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++ )
   {
      Vector3D c = f->centroid();

      HalfedgeIter h = f->halfedge();
      do
      {

         HalfedgeIter h1 = h;
         HalfedgeIter h2 = h->next();

         Vector3D a1, b1, p1, q1, r1;
         Vector3D a2, b2, p2, q2, r2;

         h1->getPickPoints( a1, b1, p1, q1, r1 );
         h2->getPickPoints( a2, b2, p2, q2, r2 );

         glBegin( GL_TRIANGLES );

         // vertex
         newPickElement( pickID, elementAddress(h2->vertex()) );
         glVertex3dv( &a1.x );
         glVertex3dv( &p1.x );
         glVertex3dv( &r1.x );

         // face
         newPickElement( pickID, elementAddress(f) );
         glVertex3dv( &b1.x );
         glVertex3dv( &b2.x );
         glVertex3dv( &c.x );

         glEnd();

         glBegin( GL_QUADS );

         // edge
         newPickElement( pickID, elementAddress(h2->edge()) );
         glVertex3dv( &p1.x );
         glVertex3dv( &r2.x );
         glVertex3dv( &q2.x );
         glVertex3dv( &q1.x );

         // halfedge
         newPickElement( pickID, elementAddress(h2) );
         glVertex3dv( &q1.x );
         glVertex3dv( &q2.x );
         glVertex3dv( &b2.x );
         glVertex3dv( &b1.x );

         glEnd();

         h = h->next();
      }
      while( h != f->halfedge() );
   }

   if (transformed) {
     glPopMatrix();
     int i = 0;
     for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
       v->position = originalPositions[i++];
     }
   }
}